

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

_Bool Curl_pipeline_penalized(SessionHandle *data,connectdata *conn)

{
  curl_off_t cVar1;
  curl_off_t cVar2;
  char *pcVar3;
  SessionHandle *recv_handle;
  curl_off_t recv_size;
  curl_off_t chunk_penalty_size;
  curl_off_t penalty_size;
  _Bool penalized;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  if (data == (SessionHandle *)0x0) {
    data_local._7_1_ = false;
  }
  else {
    data_local._7_1_ = false;
    cVar1 = Curl_multi_content_length_penalty_size(data->multi);
    cVar2 = Curl_multi_chunk_length_penalty_size(data->multi);
    recv_handle = (SessionHandle *)0xfffffffffffffffe;
    if ((((conn->recv_pipe != (curl_llist *)0x0) &&
         (conn->recv_pipe->head != (curl_llist_element *)0x0)) &&
        (recv_handle = *(SessionHandle **)((long)conn->recv_pipe->head->ptr + 0x78), 0 < cVar1)) &&
       (cVar1 < (long)recv_handle)) {
      data_local._7_1_ = true;
    }
    if ((0 < cVar2) && (cVar2 < (conn->chunk).datasize)) {
      data_local._7_1_ = true;
    }
    pcVar3 = "FALSE";
    if (data_local._7_1_ != false) {
      pcVar3 = "TRUE";
    }
    Curl_infof(data,"Conn: %ld (%p) Receive pipe weight: (%ld/%zu), penalized: %s\n",
               conn->connection_id,conn,recv_handle,(conn->chunk).datasize,pcVar3);
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_pipeline_penalized(struct SessionHandle *data,
                             struct connectdata *conn)
{
  if(data) {
    bool penalized = FALSE;
    curl_off_t penalty_size =
      Curl_multi_content_length_penalty_size(data->multi);
    curl_off_t chunk_penalty_size =
      Curl_multi_chunk_length_penalty_size(data->multi);
    curl_off_t recv_size = -2; /* Make it easy to spot in the log */

    /* Find the head of the recv pipe, if any */
    if(conn->recv_pipe && conn->recv_pipe->head) {
      struct SessionHandle *recv_handle = conn->recv_pipe->head->ptr;

      recv_size = recv_handle->req.size;

      if(penalty_size > 0 && recv_size > penalty_size)
        penalized = TRUE;
    }

    if(chunk_penalty_size > 0 &&
       (curl_off_t)conn->chunk.datasize > chunk_penalty_size)
      penalized = TRUE;

    infof(data, "Conn: %ld (%p) Receive pipe weight: (%"
          CURL_FORMAT_CURL_OFF_T "/%zu), penalized: %s\n",
          conn->connection_id, (void *)conn, recv_size,
          conn->chunk.datasize, penalized?"TRUE":"FALSE");
    return penalized;
  }
  return FALSE;
}